

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncRegister.cpp
# Opt level: O3

void __thiscall
SyncRegister::SyncRegister
          (SyncRegister *this,BoxArray *fine_boxes,DistributionMapping *dmap,IntVect *ref_ratio)

{
  BoxArray *this_00;
  FabSet *this_01;
  BoxArray *pBVar1;
  BoxArray *pBVar2;
  long lVar3;
  byte bVar4;
  BndryBATransformer hitrans;
  BndryBATransformer lotrans;
  BoxArray hiBA;
  BoxArray loBA;
  BATransformer local_190;
  BATransformer local_148;
  BoxArray local_100;
  BoxArray local_98;
  
  bVar4 = 0;
  amrex::BndryRegister::BndryRegister(&this->super_BndryRegister);
  (this->super_BndryRegister)._vptr_BndryRegister = (_func_int **)&PTR__SyncRegister_0080bee8;
  lVar3 = 0x970;
  do {
    amrex::FabSet::FabSet((FabSet *)((long)(this->super_BndryRegister).bndry + lVar3 + -8));
    lVar3 = lVar3 + 0x180;
  } while (lVar3 != 0x1270);
  (this->ratio).vect[2] = ref_ratio->vect[2];
  *(undefined8 *)(this->ratio).vect = *(undefined8 *)ref_ratio->vect;
  this_00 = &(this->super_BndryRegister).grids;
  pBVar1 = fine_boxes;
  pBVar2 = this_00;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)&pBVar2->m_bat = *(undefined8 *)&pBVar1->m_bat;
    pBVar1 = (BoxArray *)((long)pBVar1 + (ulong)bVar4 * -0x10 + 8);
    pBVar2 = (BoxArray *)((long)pBVar2 + (ulong)bVar4 * -0x10 + 8);
  }
  (this->super_BndryRegister).grids.m_ref.
  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fine_boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_BndryRegister).grids.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(fine_boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_BndryRegister).grids.m_simplified_list.
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fine_boxes->m_simplified_list).
       super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_BndryRegister).grids.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(fine_boxes->m_simplified_list).
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  amrex::BoxArray::coarsen(this_00,&this->ratio);
  this_01 = (FabSet *)&this->field_0xdf0;
  lVar3 = 0;
  do {
    local_148.m_bat_type = bndryReg;
    amrex::BATbndryReg::BATbndryReg
              (&local_148.m_op.m_bndryReg,(Orientation)(int)lVar3,(IndexType)0x7,0,1,0);
    local_190.m_bat_type = bndryReg;
    amrex::BATbndryReg::BATbndryReg
              (&local_190.m_op.m_bndryReg,(Orientation)((int)lVar3 + 3),(IndexType)0x7,0,1,0);
    amrex::BoxArray::BoxArray(&local_98,this_00,&local_148);
    amrex::BoxArray::BoxArray(&local_100,this_00,&local_190);
    amrex::FabSet::define
              ((FabSet *)
               &this_01[-10].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_98,dmap,1);
    amrex::FabSet::define(this_01 + -3,&local_98,dmap,1);
    amrex::FabSet::define
              ((FabSet *)
               &this_01[-7].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_100,dmap,1);
    amrex::FabSet::define(this_01,&local_100,dmap,1);
    amrex::BoxArray::~BoxArray(&local_100);
    amrex::BoxArray::~BoxArray(&local_98);
    lVar3 = lVar3 + 1;
    this_01 = this_01 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

SyncRegister::SyncRegister (const BoxArray& fine_boxes,
                            const DistributionMapping& dmap,
                            const IntVect&  ref_ratio)
    : ratio(ref_ratio)
{
    BL_ASSERT(grids.size() == 0);
    BL_ASSERT(fine_boxes.isDisjoint());

    grids = fine_boxes;
    grids.coarsen(ratio);

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
        Orientation loface(dir, Orientation::low);
        Orientation hiface(dir, Orientation::high);

        BndryBATransformer lotrans(loface, IndexType::TheNodeType(), 0, 1, 0);
        BndryBATransformer hitrans(hiface, IndexType::TheNodeType(), 0, 1, 0);

        BoxArray loBA(grids, lotrans);
        BoxArray hiBA(grids, hitrans);

        bndry[loface].define(loBA,dmap,1);
        bndry_mask[loface].define(loBA,dmap,1);
        bndry[hiface].define(hiBA,dmap,1);
        bndry_mask[hiface].define(hiBA,dmap,1);
    }
}